

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::DwaCompressor::compress(DwaCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int inSize_00;
  Box2i local_40;
  
  iVar3 = this->_min[0];
  iVar1 = this->_max[0];
  iVar2 = (*(this->super_Compressor)._vptr_Compressor[2])();
  local_40.max.y = iVar2 + minY + -1;
  local_40.min.x = iVar3;
  local_40.min.y = minY;
  local_40.max.x = iVar1;
  iVar3 = compress(this,inPtr,inSize_00,&local_40,outPtr);
  return iVar3;
}

Assistant:

int
DwaCompressor::compress
    (const char *inPtr,
     int inSize,
     int minY,
     const char *&outPtr)
{
    return compress
        (inPtr,
         inSize, 
         IMATH_NAMESPACE::Box2i (IMATH_NAMESPACE::V2i (_min[0], minY),
                                 IMATH_NAMESPACE::V2i (_max[0], minY + numScanLines() - 1)),
         outPtr);
}